

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printDefun(JSPrinter *this,Ref node)

{
  Ref *pRVar1;
  Value *pVVar2;
  char *pcVar3;
  size_t *psVar4;
  size_t sVar5;
  undefined8 *puVar6;
  ulong local_28;
  size_t i;
  Ref args;
  JSPrinter *this_local;
  Ref node_local;
  
  args.inst = (Value *)this;
  this_local = (JSPrinter *)node.inst;
  emit(this,"function ");
  pRVar1 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
  pVVar2 = Ref::operator->(pRVar1);
  pcVar3 = Value::getCString(pVVar2);
  emit(this,pcVar3);
  emit(this,'(');
  psVar4 = (size_t *)cashew::Ref::operator[]((uint)&this_local);
  i = *psVar4;
  local_28 = 0;
  while( true ) {
    pVVar2 = Ref::operator->((Ref *)&i);
    sVar5 = Value::size(pVVar2);
    if (sVar5 <= local_28) break;
    if (local_28 != 0) {
      if ((this->pretty & 1U) == 0) {
        emit(this,',');
      }
      else {
        emit(this,", ");
      }
    }
    pRVar1 = (Ref *)cashew::Ref::operator[]((uint)&i);
    pVVar2 = Ref::operator->(pRVar1);
    pcVar3 = Value::getCString(pVVar2);
    emit(this,pcVar3);
    local_28 = local_28 + 1;
  }
  emit(this,')');
  space(this);
  pVVar2 = Ref::operator->((Ref *)&this_local);
  sVar5 = Value::size(pVVar2);
  if (sVar5 != 3) {
    pRVar1 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
    pVVar2 = Ref::operator->(pRVar1);
    sVar5 = Value::size(pVVar2);
    if (sVar5 != 0) {
      emit(this,'{');
      this->indent = this->indent + 1;
      newline(this);
      puVar6 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
      printStats(this,(Value *)*puVar6);
      this->indent = this->indent + -1;
      newline(this);
      emit(this,'}');
      newline(this);
      return;
    }
  }
  emit(this,"{}");
  return;
}

Assistant:

void printDefun(Ref node) {
    emit("function ");
    emit(node[1]->getCString());
    emit('(');
    Ref args = node[2];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        (pretty ? emit(", ") : emit(','));
      }
      emit(args[i]->getCString());
    }
    emit(')');
    space();
    if (node->size() == 3 || node[3]->size() == 0) {
      emit("{}");
      return;
    }
    emit('{');
    indent++;
    newline();
    printStats(node[3]);
    indent--;
    newline();
    emit('}');
    newline();
  }